

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODCode39Reader.cpp
# Opt level: O3

string * ZXing::OneD::DecodeCode39AndCode93FullASCII
                   (string *__return_storage_ptr__,string *encoded,char *ctrl)

{
  byte bVar1;
  pointer pcVar2;
  undefined8 uVar3;
  byte bVar4;
  char *pcVar5;
  byte *pbVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  size_type *psVar8;
  byte *pbVar9;
  byte *pbVar10;
  
  pbVar6 = (byte *)(encoded->_M_dataplus)._M_p;
  pbVar9 = pbVar6;
  pbVar10 = pbVar6;
  if (encoded->_M_string_length != 0) {
    do {
      bVar4 = *pbVar9;
      pcVar5 = strchr(ctrl,(int)(char)bVar4);
      if (pcVar5 != (char *)0x0) {
        bVar1 = pbVar9[1];
        if (0x19 < (byte)(bVar1 + 0xbf)) {
          paVar7 = &__return_storage_ptr__->field_2;
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar7;
          psVar8 = &__return_storage_ptr__->_M_string_length;
          goto LAB_0015b907;
        }
        pbVar9 = pbVar9 + 1;
        if (bVar4 == *ctrl) {
          bVar4 = bVar1 - 0x40;
        }
        else if (bVar4 == ctrl[1]) {
          bVar4 = PERCENTAGE_MAPPING[(byte)(bVar1 + 0xbf)];
        }
        else if (bVar4 == ctrl[2]) {
          bVar4 = bVar1 - 0x20;
        }
        else {
          bVar4 = bVar1 | 0x20;
        }
      }
      *pbVar10 = bVar4;
      pbVar10 = pbVar10 + 1;
      pbVar9 = pbVar9 + 1;
      pbVar6 = (byte *)(encoded->_M_dataplus)._M_p;
    } while (pbVar9 != pbVar6 + encoded->_M_string_length);
  }
  encoded->_M_string_length = (long)pbVar10 - (long)pbVar6;
  *pbVar10 = 0;
  pcVar2 = (encoded->_M_dataplus)._M_p;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  paVar7 = &encoded->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar7) {
    uVar3 = *(undefined8 *)((long)&encoded->field_2 + 8);
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar7->_M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar7->_M_allocated_capacity;
  }
  psVar8 = &encoded->_M_string_length;
  __return_storage_ptr__->_M_string_length = encoded->_M_string_length;
  (encoded->_M_dataplus)._M_p = (pointer)paVar7;
LAB_0015b907:
  *psVar8 = 0;
  paVar7->_M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string DecodeCode39AndCode93FullASCII(std::string encoded, const char ctrl[4])
{
	auto out = encoded.begin();
	for (auto in = encoded.cbegin(); in != encoded.cend(); ++in) {
		char c = *in;
		if (Contains(ctrl, c)) {
			char next = *++in; // if in is one short of cend(), then next == 0
			if (next < 'A' || next > 'Z')
				return {};
			if (c == ctrl[0])
				c = next - 64; // $A to $Z map to control codes SH to SB
			else if (c == ctrl[1])
				c = PERCENTAGE_MAPPING[next - 'A'];
			else if (c == ctrl[2])
				c = next - 32; // /A to /O map to ! to , and /Z maps to :
			else
				c = next + 32; // +A to +Z map to a to z
		}
		*out++ = c;
	}
	encoded.erase(out, encoded.end());
	return encoded;
}